

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O1

void __thiscall
webrtc::NoiseSuppressionImpl::Suppressor::Suppressor(Suppressor *this,int sample_rate_hz)

{
  NsHandle *pNVar1;
  string *result;
  ostream *poVar2;
  int local_18c;
  FatalMessage local_188;
  
  this->state_ = (NsState *)0x0;
  pNVar1 = WebRtcNs_Create();
  this->state_ = pNVar1;
  if (pNVar1 == (NsHandle *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
               ,0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188,"Check failed: state_",0x14);
    std::ios::widen((char)(ostream *)&local_188 +
                    (char)*(undefined8 *)(CONCAT44(local_188._4_4_,local_188._0_4_) + -0x18));
    std::ostream::put((char)&local_188);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
    rtc::FatalMessage::~FatalMessage(&local_188);
  }
  local_18c = WebRtcNs_Init(this->state_,sample_rate_hz);
  local_188.stream_ = (ostringstream)0x0;
  local_188._1_3_ = 0;
  if (local_18c == 0) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<int,int>((int *)&local_188,&local_18c,"0 == error");
  }
  if (result == (string *)0x0) {
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
             ,0x25,result);
  rtc::FatalMessage::~FatalMessage(&local_188);
}

Assistant:

explicit Suppressor(int sample_rate_hz) {
    state_ = NS_CREATE();
    RTC_CHECK(state_);
    int error = NS_INIT(state_, sample_rate_hz);
    RTC_DCHECK_EQ(0, error);
  }